

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  long lVar1;
  byte bVar2;
  int a_00;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  stbi_uc *psVar9;
  char *pcVar10;
  void *__ptr;
  byte *pbVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  stbi__uint32 sVar15;
  uint uVar16;
  size_t __n;
  size_t sVar17;
  ushort *puVar18;
  ulong uVar19;
  ushort *src;
  byte *__src;
  byte bVar20;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  size_t __n_00;
  uint uVar24;
  stbi_uc *dest;
  char cVar25;
  ulong uVar26;
  uint uVar27;
  byte *pbVar29;
  long in_FS_OFFSET;
  bool bVar30;
  ulong uVar28;
  
  bVar30 = depth == 0x10;
  iVar5 = x * out_n << bVar30;
  a_00 = a->s->img_n;
  uVar6 = a_00 << bVar30;
  if (a_00 + 1 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                  ,0x1266,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar9 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar30,0);
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
    return 0;
  }
  iVar7 = stbi__mad3sizes_valid(a_00,x,depth,7);
  if (iVar7 != 0) {
    uVar8 = a_00 * x;
    uVar22 = uVar8 * depth + 7 >> 3;
    if ((int)y < 0) {
      bVar30 = true;
    }
    else if (y == 0) {
      bVar30 = false;
    }
    else {
      bVar30 = (uint)(0x7fffffff / (ulong)y) < uVar22;
    }
    if ((!bVar30) && ((int)(uVar22 * y) <= (int)(uVar22 ^ 0x7fffffff))) {
      if (raw_len < (uVar22 + 1) * y) {
        pcVar10 = "not enough pixels";
      }
      else {
        __ptr = malloc((ulong)(uVar22 * 2));
        if (__ptr != (void *)0x0) {
          uVar16 = 1;
          if (depth < 8) {
            uVar6 = 1;
          }
          if (y != 0) {
            sVar15 = x;
            if (depth < 8) {
              sVar15 = uVar22;
            }
            uVar16 = sVar15 * uVar6;
            __n_00 = (size_t)(int)uVar6;
            __n = (size_t)(int)uVar16;
            lVar1 = __n_00 + 1;
            bVar4 = 1;
            bVar21 = 1;
            uVar27 = 0;
            uVar26 = 0;
            do {
              uVar28 = (ulong)uVar27;
              uVar12 = 0;
              if ((uVar26 & 1) != 0) {
                uVar12 = (ulong)uVar22;
              }
              __src = raw + 1;
              bVar2 = *raw;
              uVar19 = (ulong)bVar2;
              if (uVar19 < 5) {
                if (uVar26 == 0) {
                  uVar19 = (ulong)""[uVar19];
                }
                src = (ushort *)(uVar12 + (long)__ptr);
                psVar9 = a->out;
                if ((byte)uVar19 < 6) {
                  uVar12 = (ulong)((bVar21 & 1) * uVar22);
                  pbVar11 = (byte *)((long)__ptr + uVar12);
                  switch(uVar19) {
                  case 0:
                    memcpy(src,__src,__n);
                    break;
                  case 1:
                    memcpy(src,__src,__n_00);
                    if ((int)uVar6 < (int)uVar16) {
                      lVar13 = 0;
                      do {
                        *(byte *)((long)src + lVar13 + __n_00) =
                             *(byte *)((long)src + lVar13) + raw[lVar13 + lVar1];
                        lVar13 = lVar13 + 1;
                      } while ((__n_00 - __n) + lVar13 != 0);
                    }
                    break;
                  case 2:
                    if (0 < (int)uVar16) {
                      uVar12 = 0;
                      do {
                        *(byte *)((long)src + uVar12) = pbVar11[uVar12] + __src[uVar12];
                        uVar12 = uVar12 + 1;
                      } while (uVar16 != uVar12);
                    }
                    break;
                  case 3:
                    if (0 < (int)uVar6) {
                      uVar19 = 0;
                      do {
                        *(byte *)((long)src + uVar19) = (pbVar11[uVar19] >> 1) + __src[uVar19];
                        uVar19 = uVar19 + 1;
                      } while (uVar6 != uVar19);
                    }
                    if ((int)uVar6 < (int)uVar16) {
                      pbVar11 = (byte *)((long)__ptr + uVar12 + __n_00);
                      pbVar29 = raw + lVar1;
                      sVar17 = __n;
                      puVar18 = src;
                      do {
                        *(byte *)((long)puVar18 + __n_00) =
                             (char)((uint)(byte)*puVar18 + (uint)*pbVar11 >> 1) + *pbVar29;
                        puVar18 = (ushort *)((long)puVar18 + 1);
                        pbVar29 = pbVar29 + 1;
                        pbVar11 = pbVar11 + 1;
                        sVar17 = sVar17 - 1;
                      } while (__n_00 != sVar17);
                    }
                    break;
                  case 4:
                    if (0 < (int)uVar6) {
                      uVar12 = 0;
                      do {
                        *(byte *)((long)src + uVar12) = pbVar11[uVar12] + __src[uVar12];
                        uVar12 = uVar12 + 1;
                      } while (uVar6 != uVar12);
                    }
                    if ((int)uVar6 < (int)uVar16) {
                      pbVar29 = raw + lVar1;
                      sVar17 = __n;
                      puVar18 = src;
                      do {
                        bVar14 = (byte)*puVar18;
                        bVar20 = *pbVar11;
                        uVar23 = (uint)bVar14;
                        iVar7 = (((uint)bVar20 + (uint)bVar20 * 2) - (uint)pbVar11[__n_00]) - uVar23
                        ;
                        uVar24 = (uint)pbVar11[__n_00];
                        uVar3 = uVar24;
                        if (uVar23 < uVar24) {
                          uVar3 = (uint)bVar14;
                        }
                        if (uVar24 < uVar23) {
                          uVar24 = (uint)bVar14;
                        }
                        uVar23 = (uint)bVar20;
                        if ((int)uVar24 <= iVar7) {
                          uVar23 = uVar3;
                        }
                        cVar25 = (char)uVar23;
                        if (iVar7 <= (int)uVar3) {
                          cVar25 = (char)uVar24;
                        }
                        *(byte *)((long)puVar18 + __n_00) = cVar25 + *pbVar29;
                        puVar18 = (ushort *)((long)puVar18 + 1);
                        pbVar11 = pbVar11 + 1;
                        pbVar29 = pbVar29 + 1;
                        sVar17 = sVar17 - 1;
                      } while (__n_00 != sVar17);
                    }
                    break;
                  case 5:
                    memcpy(src,__src,__n_00);
                    if ((int)uVar6 < (int)uVar16) {
                      lVar13 = 0;
                      do {
                        *(byte *)((long)src + lVar13 + __n_00) =
                             (*(byte *)((long)src + lVar13) >> 1) + raw[lVar13 + lVar1];
                        lVar13 = lVar13 + 1;
                      } while ((__n_00 - __n) + lVar13 != 0);
                    }
                  }
                }
                dest = psVar9 + (uint)(iVar5 * (int)uVar26);
                __src = __src + __n;
                if (depth < 8) {
                  bVar14 = 1;
                  if (color == 0) {
                    bVar14 = ""[depth];
                  }
                  if (depth == 4) {
                    if (uVar8 != 0) {
                      uVar12 = 0;
                      bVar20 = 0;
                      do {
                        if ((uVar12 & 1) == 0) {
                          bVar20 = (byte)*src;
                          src = (ushort *)((long)src + 1);
                        }
                        psVar9[uVar12 + uVar28] = (bVar20 >> 4) * bVar14;
                        bVar20 = bVar20 << 4;
                        uVar12 = uVar12 + 1;
                      } while (uVar8 != (uint)uVar12);
                    }
                  }
                  else if (depth == 2) {
                    if (uVar8 != 0) {
                      uVar12 = 0;
                      bVar20 = 0;
                      do {
                        if ((uVar12 & 3) == 0) {
                          bVar20 = (byte)*src;
                          src = (ushort *)((long)src + 1);
                        }
                        psVar9[uVar12 + uVar28] = (bVar20 >> 6) * bVar14;
                        bVar20 = bVar20 << 2;
                        uVar12 = uVar12 + 1;
                      } while (uVar8 != (uint)uVar12);
                    }
                  }
                  else {
                    if (depth != 1) {
                      __assert_fail("depth == 1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                                    ,0x12ca,
                                    "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                   );
                    }
                    if (uVar8 != 0) {
                      uVar12 = 0;
                      bVar20 = 0;
                      do {
                        if ((uVar12 & 7) == 0) {
                          bVar20 = (byte)*src;
                          src = (ushort *)((long)src + 1);
                        }
                        psVar9[uVar12 + uVar28] = (char)bVar20 >> 7 & bVar14;
                        bVar20 = bVar20 * '\x02';
                        uVar12 = uVar12 + 1;
                      } while (uVar8 != (uint)uVar12);
                    }
                  }
                  if (a_00 != out_n) {
                    stbi__create_png_alpha_expand8(dest,dest,x,a_00);
                  }
                }
                else if (depth == 8) {
                  if (a_00 == out_n) {
                    memcpy(dest,src,(ulong)uVar8);
                  }
                  else {
                    stbi__create_png_alpha_expand8(dest,(stbi_uc *)src,x,a_00);
                  }
                }
                else if (depth == 0x10) {
                  if (a_00 == out_n) {
                    if (uVar8 != 0) {
                      lVar13 = 0;
                      do {
                        *(ushort *)(psVar9 + lVar13 * 2 + uVar28) =
                             src[lVar13] << 8 | src[lVar13] >> 8;
                        lVar13 = lVar13 + 1;
                      } while (uVar8 != (uint)lVar13);
                    }
                  }
                  else {
                    if (a_00 + 1 != out_n) {
                      __assert_fail("img_n+1 == out_n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                                    ,0x12e3,
                                    "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                   );
                    }
                    if (a_00 == 1) {
                      if (x != 0) {
                        lVar13 = 0;
                        do {
                          *(ushort *)(psVar9 + lVar13 * 4 + uVar28) =
                               src[lVar13] << 8 | src[lVar13] >> 8;
                          (psVar9 + lVar13 * 4 + uVar28 + 2)[0] = 0xff;
                          (psVar9 + lVar13 * 4 + uVar28 + 2)[1] = 0xff;
                          lVar13 = lVar13 + 1;
                        } while (x != (stbi__uint32)lVar13);
                      }
                    }
                    else {
                      if (a_00 != 3) {
                        __assert_fail("img_n == 3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                                      ,0x12ea,
                                      "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                     );
                      }
                      if (x != 0) {
                        lVar13 = 0;
                        do {
                          *(ushort *)(psVar9 + lVar13 * 8 + uVar28) = *src << 8 | *src >> 8;
                          *(ushort *)(psVar9 + lVar13 * 8 + uVar28 + 2) = src[1] << 8 | src[1] >> 8;
                          *(ushort *)(psVar9 + lVar13 * 8 + uVar28 + 4) = src[2] << 8 | src[2] >> 8;
                          (psVar9 + lVar13 * 8 + uVar28 + 6)[0] = 0xff;
                          (psVar9 + lVar13 * 8 + uVar28 + 6)[1] = 0xff;
                          src = src + 3;
                          lVar13 = lVar13 + 1;
                        } while (x != (stbi__uint32)lVar13);
                      }
                    }
                  }
                }
              }
              else {
                *(char **)(in_FS_OFFSET + -0x20) = "invalid filter";
                bVar4 = 0;
              }
              if (4 < bVar2) break;
              uVar26 = uVar26 + 1;
              bVar21 = bVar21 + 1;
              uVar27 = uVar27 + iVar5;
              raw = __src;
            } while (uVar26 != y);
            uVar16 = (uint)bVar4;
          }
          free(__ptr);
          return uVar16;
        }
        pcVar10 = "outofmem";
      }
      goto LAB_0011b322;
    }
  }
  pcVar10 = "too large";
LAB_0011b322:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar10;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16 ? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   stbi_uc *filter_buf;
   int all_ok = 1;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   // note: error exits here don't need to clean up a->out individually,
   // stbi__do_png always does on error.
   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   if (!stbi__mad2sizes_valid(img_width_bytes, y, img_width_bytes)) return stbi__err("too large", "Corrupt PNG");
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   // Allocate two scan lines worth of filter workspace buffer.
   filter_buf = (stbi_uc *) stbi__malloc_mad2(img_width_bytes, 2, 0);
   if (!filter_buf) return stbi__err("outofmem", "Out of memory");

   // Filtering for low-bit-depth images
   if (depth < 8) {
      filter_bytes = 1;
      width = img_width_bytes;
   }

   for (j=0; j < y; ++j) {
      // cur/prior filter buffers alternate
      stbi_uc *cur = filter_buf + (j & 1)*img_width_bytes;
      stbi_uc *prior = filter_buf + (~j & 1)*img_width_bytes;
      stbi_uc *dest = a->out + stride*j;
      int nk = width * filter_bytes;
      int filter = *raw++;

      // check filter type
      if (filter > 4) {
         all_ok = stbi__err("invalid filter","Corrupt PNG");
         break;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // perform actual filtering
      switch (filter) {
      case STBI__F_none:
         memcpy(cur, raw, nk);
         break;
      case STBI__F_sub:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]);
         break;
      case STBI__F_up:
         for (k = 0; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]);
         break;
      case STBI__F_avg:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1));
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1));
         break;
      case STBI__F_paeth:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]); // prior[k] == stbi__paeth(0,prior[k],0)
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes], prior[k], prior[k-filter_bytes]));
         break;
      case STBI__F_avg_first:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1));
         break;
      }

      raw += nk;

      // expand decoded bits in cur to dest, also adding an extra alpha channel if desired
      if (depth < 8) {
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range
         stbi_uc *in = cur;
         stbi_uc *out = dest;
         stbi_uc inb = 0;
         stbi__uint32 nsmp = x*img_n;

         // expand bits to bytes first
         if (depth == 4) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 1) == 0) inb = *in++;
               *out++ = scale * (inb >> 4);
               inb <<= 4;
            }
         } else if (depth == 2) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 3) == 0) inb = *in++;
               *out++ = scale * (inb >> 6);
               inb <<= 2;
            }
         } else {
            STBI_ASSERT(depth == 1);
            for (i=0; i < nsmp; ++i) {
               if ((i & 7) == 0) inb = *in++;
               *out++ = scale * (inb >> 7);
               inb <<= 1;
            }
         }

         // insert alpha=255 values if desired
         if (img_n != out_n)
            stbi__create_png_alpha_expand8(dest, dest, x, img_n);
      } else if (depth == 8) {
         if (img_n == out_n)
            memcpy(dest, cur, x*img_n);
         else
            stbi__create_png_alpha_expand8(dest, cur, x, img_n);
      } else if (depth == 16) {
         // convert the image data from big-endian to platform-native
         stbi__uint16 *dest16 = (stbi__uint16*)dest;
         stbi__uint32 nsmp = x*img_n;

         if (img_n == out_n) {
            for (i = 0; i < nsmp; ++i, ++dest16, cur += 2)
               *dest16 = (cur[0] << 8) | cur[1];
         } else {
            STBI_ASSERT(img_n+1 == out_n);
            if (img_n == 1) {
               for (i = 0; i < x; ++i, dest16 += 2, cur += 2) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = 0xffff;
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i = 0; i < x; ++i, dest16 += 4, cur += 6) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = (cur[2] << 8) | cur[3];
                  dest16[2] = (cur[4] << 8) | cur[5];
                  dest16[3] = 0xffff;
               }
            }
         }
      }
   }

   STBI_FREE(filter_buf);
   if (!all_ok) return 0;

   return 1;
}